

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O3

MOJOSHADER_irExpression *
new_ir_binop(Context_conflict *ctx,MOJOSHADER_irBinOpType op,MOJOSHADER_irExpression *left,
            MOJOSHADER_irExpression *right)

{
  int iVar1;
  MOJOSHADER_irExpression *pMVar2;
  
  if (right != (MOJOSHADER_irExpression *)0x0 && left != (MOJOSHADER_irExpression *)0x0) {
    pMVar2 = (MOJOSHADER_irExpression *)(*ctx->malloc)(0x38,ctx->malloc_data);
    if (pMVar2 != (MOJOSHADER_irExpression *)0x0) {
      (pMVar2->ir).type = MOJOSHADER_IR_BINOP;
      (pMVar2->ir).filename = ctx->sourcefile;
      (pMVar2->ir).line = ctx->sourceline;
      (pMVar2->info).type = (left->info).type;
      iVar1 = (left->info).elements;
      (pMVar2->info).elements = iVar1;
      if ((left->info).type != (right->info).type) {
        __assert_fail("left->info.type == right->info.type",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                      ,0x1201,
                      "MOJOSHADER_irExpression *new_ir_binop(Context *, const MOJOSHADER_irBinOpType, MOJOSHADER_irExpression *, MOJOSHADER_irExpression *)"
                     );
      }
      if (iVar1 == (right->info).elements) {
        (pMVar2->binop).op = op;
        (pMVar2->binop).left = left;
        (pMVar2->binop).right = right;
        return pMVar2;
      }
      __assert_fail("left->info.elements == right->info.elements",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                    ,0x1202,
                    "MOJOSHADER_irExpression *new_ir_binop(Context *, const MOJOSHADER_irBinOpType, MOJOSHADER_irExpression *, MOJOSHADER_irExpression *)"
                   );
    }
    ctx->isfail = 1;
    ctx->out_of_memory = 1;
  }
  return (MOJOSHADER_irExpression *)0x0;
}

Assistant:

static MOJOSHADER_irExpression *new_ir_binop(Context *ctx,
                                       const MOJOSHADER_irBinOpType op,
                                       MOJOSHADER_irExpression *left,
                                       MOJOSHADER_irExpression *right)
{
    if ((!left) || (!right)) return NULL;
    NEW_IR_EXPR(retval, MOJOSHADER_irBinOp, MOJOSHADER_IR_BINOP, left->info.type, left->info.elements);
    assert(left->info.type == right->info.type);
    assert(left->info.elements == right->info.elements);
    retval->op = op;
    retval->left = left;
    retval->right = right;
    return (MOJOSHADER_irExpression *) retval;
}